

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall enact::Parser::Parser(Parser *this,CompileContext *context)

{
  allocator<char> local_39;
  string local_38;
  CompileContext *local_18;
  CompileContext *context_local;
  Parser *this_local;
  
  this->m_context = context;
  local_18 = context;
  context_local = (CompileContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Lexer::Lexer(&this->m_scanner,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->m_previous).type = LEFT_PAREN;
  std::__cxx11::string::string((string *)&(this->m_previous).lexeme);
  (this->m_previous).line = 0;
  (this->m_previous).col = 0;
  (this->m_current).type = LEFT_PAREN;
  std::__cxx11::string::string((string *)&(this->m_current).lexeme);
  (this->m_current).line = 0;
  (this->m_current).col = 0;
  this->m_hadError = false;
  return;
}

Assistant:

Parser::Parser(CompileContext &context) : m_context{context} {
    }